

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_get_string_vector
          (exr_const_context_t ctxt,int part_index,char *name,int32_t *size,char **out)

{
  exr_result_t eVar1;
  int *in_RCX;
  exr_attribute_list_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_attribute_t **in_R8;
  int32_t i;
  exr_const_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  long local_38;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock((exr_const_context_t)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if ((in_RDX == (exr_attribute_list_t *)0x0) || ((char)in_RDX->num_attributes == '\0')) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,3,"Invalid name for stringvector attribute query");
    }
    else {
      local_4 = exr_attr_list_find_by_name
                          ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                           (char *)in_RCX,in_R8);
      if (local_4 == 0) {
        if (*(int *)(local_38 + 0x14) == 0x14) {
          if (in_RCX == (int *)0x0) {
            if (*in_RDI == '\x01') {
              internal_exr_unlock((exr_const_context_t)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            }
            local_4 = (**(code **)(in_RDI + 0x40))
                                (in_RDI,3,"size parameter required to query stringvector");
          }
          else {
            if (in_R8 != (exr_attribute_t **)0x0) {
              if (*in_RCX < **(int **)(local_38 + 0x18)) {
                if (*in_RDI == '\x01') {
                  internal_exr_unlock((exr_const_context_t)
                                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
                  ;
                }
                eVar1 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "\'%s\' array buffer too small (%d) to hold string values (%d)",
                                   in_RDX,*in_RCX,**(undefined4 **)(local_38 + 0x18));
                return eVar1;
              }
              for (in_stack_ffffffffffffffb4 = 0;
                  in_stack_ffffffffffffffb4 < **(int **)(local_38 + 0x18);
                  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
                in_R8[in_stack_ffffffffffffffb4] =
                     *(exr_attribute_t **)
                      (*(long *)(*(long *)(local_38 + 0x18) + 8) +
                       (long)in_stack_ffffffffffffffb4 * 0x10 + 8);
              }
            }
            *in_RCX = **(int **)(local_38 + 0x18);
            if (*in_RDI == '\x01') {
              internal_exr_unlock((exr_const_context_t)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            }
          }
        }
        else {
          if (*in_RDI == '\x01') {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          }
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0x10,
                               "\'%s\' requested type \'stringvector\', but stored attributes is type \'%s\'"
                               ,in_RDX,*(undefined8 *)(local_38 + 8));
        }
      }
      else if (*in_RDI == '\x01') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_get_string_vector (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    int32_t*            size,
    const char**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_STRING_VECTOR, stringvector);
    if (!size)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "size parameter required to query stringvector"));
    if (out)
    {
        if (*size < attr->stringvector->n_strings)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "'%s' array buffer too small (%d) to hold string values (%d)",
                name,
                *size,
                attr->stringvector->n_strings));
        for (int32_t i = 0; i < attr->stringvector->n_strings; ++i)
            out[i] = attr->stringvector->strings[i].str;
    }
    *size = attr->stringvector->n_strings;
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}